

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

bool __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
CheckEmptySubCon<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
          *prepro)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  bVar2 = *(size_ty *)
           ((long)&(cc->
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   ).
                   super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   .args_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
           + 0x10) == 0;
  bVar3 = *(size_ty *)
           ((long)&(cc->
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   ).
                   super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   .args_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U> + 0x10) == 0;
  if (bVar2 && bVar3) {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dVar1 = ComputeValue<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>,std::vector<double,std::allocator<double>>>
                      (cc,(vector<double,_std::allocator<double>_> *)&local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
    uVar4 = -(ulong)(prepro->lb_ < dVar1);
    uVar5 = -(ulong)(dVar1 < prepro->ub_);
    prepro->lb_ = (double)(~uVar4 & (ulong)prepro->lb_ | (ulong)dVar1 & uVar4);
    prepro->ub_ = (double)(~uVar5 & (ulong)prepro->ub_ | (ulong)dVar1 & uVar5);
  }
  return bVar2 && bVar3;
}

Assistant:

bool CheckEmptySubCon(
      const ConditionalConstraint<SubCon>& cc,
      PreprocessInfo& prepro) {
    if (cc.GetConstraint().empty()) {
#ifndef NDEBUG
      MPD(AddWarning("empty_cmp",
                     "Empty comparison in a logical constraint\n  of type '"
                     + std::string(cc.GetTypeName())
                     + "'.\n  Please contact AMPL support."));
#endif
      auto res = ComputeValue(cc, std::vector<double>{});
      prepro.narrow_result_bounds(res, res);
      return true;
    }
    return false;
  }